

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::updateEditorData
          (QAbstractItemViewPrivate *this,QModelIndex *tl,QModelIndex *br)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long *plVar5;
  QAbstractItemModel *pQVar6;
  Span *pSVar7;
  Entry *pEVar8;
  int iVar9;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  Data *pDVar15;
  long in_FS_OFFSET;
  bool bVar16;
  int iVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  int local_90;
  int local_8c;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QHash<QPersistentModelIndex,_QEditorInfo> local_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar5 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  pQVar6 = (tl->m).ptr;
  if (pQVar6 == (QAbstractItemModel *)0x0 || (tl->c | tl->r) < 0) {
    if (pQVar6 != (QAbstractItemModel *)0x0) {
      bVar16 = false;
      goto LAB_00536f29;
    }
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48 = (undefined1 *)0x0;
    bVar16 = false;
  }
  else {
    bVar16 = false;
    if ((-1 < br->r) && (-1 < br->c)) {
      bVar16 = (br->m).ptr != (QAbstractItemModel *)0x0;
    }
LAB_00536f29:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)pQVar6 + 0x68))(&local_58,pQVar6,tl);
  }
  local_60.d = (this->indexEditorHash).d;
  if (local_60.d == (Data *)0x0) {
LAB_00536f71:
    uVar12 = 0;
    pDVar15 = (Data *)0x0;
LAB_00536f76:
    if (uVar12 == 0 && pDVar15 == (Data *)0x0) goto LAB_00537133;
  }
  else {
    if (((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      ((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (local_60.d == (Data *)0x0) goto LAB_00536f71;
    }
    pDVar15 = local_60.d;
    if ((local_60.d)->spans->offsets[0] == 0xff) {
      uVar11 = 1;
      do {
        uVar12 = uVar11;
        if ((local_60.d)->numBuckets == uVar12) {
          uVar12 = 0;
          pDVar15 = (Data *)0x0;
          break;
        }
        uVar11 = uVar12 + 1;
      } while ((local_60.d)->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f] == 0xff);
      goto LAB_00536f76;
    }
    uVar12 = 0;
  }
  do {
    pSVar7 = pDVar15->spans;
    uVar11 = uVar12 >> 7;
    uVar14 = (uint)uVar12 & 0x7f;
    lVar13 = *(long *)(pSVar7[uVar11].entries[pSVar7[uVar11].offsets[uVar14]].storage.data + 8);
    if ((lVar13 == 0) || (*(int *)(lVar13 + 4) == 0)) {
      lVar13 = 0;
    }
    else {
      lVar13 = *(long *)(pSVar7[uVar11].entries[pSVar7[uVar11].offsets[uVar14]].storage.data + 0x10)
      ;
    }
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_78,
               (QPersistentModelIndex *)(pSVar7[uVar11].entries + pSVar7[uVar11].offsets[uVar14]));
    if ((lVar13 != 0) &&
       (pEVar8 = pDVar15->spans[uVar11].entries,
       pEVar8[pDVar15->spans[uVar11].offsets[uVar14]].storage.data[0x18] == '\0')) {
      iVar17 = (int)local_78;
      iVar19 = (int)((ulong)local_78 >> 0x20);
      auVar20._0_4_ = -(uint)(-1 < iVar17);
      auVar20._4_4_ = -(uint)(-1 < iVar17);
      auVar20._8_4_ = -(uint)(-1 < (long)local_78);
      auVar20._12_4_ = -(uint)(-1 < (long)local_78);
      iVar9 = movmskpd((int)pEVar8,auVar20);
      if (local_68.ptr != (QAbstractItemModel *)0x0 && iVar9 == 3) {
        if (bVar16) {
          uVar1 = tl->r;
          uVar3 = tl->c;
          uVar2 = br->r;
          uVar4 = br->c;
          auVar18._0_4_ = -(uint)((int)uVar2 < iVar17);
          auVar18._4_4_ = -(uint)((int)uVar4 < iVar19);
          auVar18._8_4_ = -(uint)(iVar17 < (int)uVar1);
          auVar18._12_4_ = -(uint)(iVar19 < (int)uVar3);
          iVar9 = movmskps((int)br,auVar18);
          if (iVar9 == 0) {
            (**(code **)(*(long *)local_68.ptr + 0x68))(&local_90,local_68.ptr,&local_78);
            if ((((local_90 == (int)local_58) && (local_8c == local_58._4_4_)) &&
                (local_88 == puStack_50)) && (local_80 == local_48)) goto LAB_005370c1;
          }
        }
        else {
LAB_005370c1:
          plVar10 = (long *)(**(code **)(*plVar5 + 0x208))(plVar5,&local_78);
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 0x80))(plVar10,lVar13,&local_78);
          }
        }
      }
    }
    do {
      if (pDVar15->numBuckets - 1 == uVar12) {
        uVar12 = 0;
        pDVar15 = (Data *)0x0;
        break;
      }
      uVar12 = uVar12 + 1;
    } while (pDVar15->spans[uVar12 >> 7].offsets[(uint)uVar12 & 0x7f] == 0xff);
  } while ((uVar12 != 0) || (pDVar15 != (Data *)0x0));
LAB_00537133:
  QHash<QPersistentModelIndex,_QEditorInfo>::~QHash(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::updateEditorData(const QModelIndex &tl, const QModelIndex &br)
{
    Q_Q(QAbstractItemView);
    // we are counting on having relatively few editors
    const bool checkIndexes = tl.isValid() && br.isValid();
    const QModelIndex parent = tl.parent();
    // QTBUG-25370: We need to copy the indexEditorHash, because while we're
    // iterating over it, we are calling methods which can allow user code to
    // call a method on *this which can modify the member indexEditorHash.
    const QIndexEditorHash indexEditorHashCopy = indexEditorHash;
    QIndexEditorHash::const_iterator it = indexEditorHashCopy.constBegin();
    for (; it != indexEditorHashCopy.constEnd(); ++it) {
        QWidget *editor = it.value().widget.data();
        const QModelIndex index = it.key();
        if (it.value().isStatic || !editor || !index.isValid() ||
            (checkIndexes
                && (index.row() < tl.row() || index.row() > br.row()
                    || index.column() < tl.column() || index.column() > br.column()
                    || index.parent() != parent)))
            continue;

        QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        if (delegate) {
            delegate->setEditorData(editor, index);
        }
    }
}